

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

int uv_inet_ntop(int af,void *src,char *dst,size_t size)

{
  size_t size_local;
  char *dst_local;
  void *src_local;
  int af_local;
  
  if (af == 2) {
    src_local._4_4_ = inet_ntop4((uchar *)src,dst,size);
  }
  else if (af == 10) {
    src_local._4_4_ = inet_ntop6((uchar *)src,dst,size);
  }
  else {
    src_local._4_4_ = -0x61;
  }
  return src_local._4_4_;
}

Assistant:

int uv_inet_ntop(int af, const void* src, char* dst, size_t size) {
  switch (af) {
  case AF_INET:
    return (inet_ntop4(src, dst, size));
  case AF_INET6:
    return (inet_ntop6(src, dst, size));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}